

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int unixShmMap(sqlite3_file *fd,int iRegion,int szRegion,int bExtend,void **pp)

{
  code *zBuf;
  ushort uVar1;
  long lVar2;
  sqlite3_io_methods *psVar3;
  sqlite3_io_methods *psVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  sqlite3_io_methods *p;
  sqlite3_mutex *psVar8;
  _func_int_sqlite3_file_ptr_sqlite3_int64 *__s;
  int *piVar9;
  void *pvVar10;
  uint *puVar11;
  size_t sVar12;
  size_t __n;
  long lVar13;
  char *pcVar14;
  long lVar15;
  long iOff;
  bool bVar16;
  stat sStat;
  undefined1 local_c0 [24];
  uint local_a8;
  uint local_a4;
  uint local_a0;
  long local_90;
  
  if (fd[8].pMethods == (sqlite3_io_methods *)0x0) {
    iVar5 = sqlite3_initialize();
    if (iVar5 == 0) {
      p = (sqlite3_io_methods *)sqlite3Malloc(0x18);
    }
    else {
      p = (sqlite3_io_methods *)0x0;
    }
    if (p == (sqlite3_io_methods *)0x0) {
      iVar5 = 7;
    }
    else {
      *(undefined8 *)p = 0;
      p->xClose = (_func_int_sqlite3_file_ptr *)0x0;
      p->xRead = (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)0x0;
      if (sqlite3Config.bCoreMutex == 0) {
        psVar8 = (sqlite3_mutex *)0x0;
      }
      else {
        psVar8 = (*sqlite3Config.mutex.xMutexAlloc)(2);
      }
      if (psVar8 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(psVar8);
      }
      psVar3 = fd[2].pMethods;
      __s = psVar3->xTruncate;
      if (__s == (_func_int_sqlite3_file_ptr_sqlite3_int64 *)0x0) {
        iVar5 = (*aSyscall[5].pCurrent)((ulong)*(uint *)&fd[3].pMethods);
        if ((iVar5 == 0) || (*(char *)((long)&psVar3->xRead + 5) != '\0')) {
          sVar12 = strlen((char *)fd[7].pMethods);
          __n = (long)(int)sVar12 + 0x46;
          iVar5 = sqlite3_initialize();
          if (iVar5 == 0) {
            __s = (_func_int_sqlite3_file_ptr_sqlite3_int64 *)sqlite3Malloc((int)__n);
          }
          else {
            __s = (_func_int_sqlite3_file_ptr_sqlite3_int64 *)0x0;
          }
          iVar5 = 7;
          if (__s == (_func_int_sqlite3_file_ptr_sqlite3_int64 *)0x0) goto LAB_00157104;
          memset(__s,0,__n);
          zBuf = __s + 0x40;
          *(code **)(__s + 0x10) = zBuf;
          sqlite3_snprintf((int)sVar12 + 6,(char *)zBuf,"%s-shm");
          *(undefined4 *)(__s + 0x18) = 0xffffffff;
          psVar4 = fd[2].pMethods;
          psVar4->xTruncate = __s;
          *(sqlite3_io_methods **)__s = psVar4;
          iVar6 = sqlite3_initialize();
          if (iVar6 == 0) {
            psVar8 = (*sqlite3Config.mutex.xMutexAlloc)(0);
          }
          else {
            psVar8 = (sqlite3_mutex *)0x0;
          }
          *(sqlite3_mutex **)(__s + 8) = psVar8;
          if (psVar8 == (sqlite3_mutex *)0x0) goto LAB_00157135;
          if (*(char *)((long)&psVar3->xRead + 5) == '\0') {
            iVar6 = 0;
            iVar5 = sqlite3_uri_boolean((char *)fd[7].pMethods,"readonly_shm",0);
            if (iVar5 == 0) {
              iVar6 = 0x42;
            }
            else {
              __s[0x22] = (code)0x1;
            }
            uVar7 = robust_open((char *)zBuf,iVar6,local_a8 & 0x1ff);
            *(uint *)(__s + 0x18) = uVar7;
            if ((int)uVar7 < 0) {
              bVar16 = false;
              iVar5 = 0xe;
              sqlite3_log(0xe,"cannot open file at line %d of [%.10s]",0x6ab0,
                          "118a3b35693b134d56ebd780123b7fd6f1497668");
              unixLogErrorAtLine(0xe,"open",(char *)zBuf,0x6ab0);
            }
            else {
              (*aSyscall[0x14].pCurrent)((ulong)uVar7,(ulong)local_a4,(ulong)local_a0);
              if ((*(int *)(__s + 0x18) < 0) || (iVar5 = (*aSyscall[7].pCurrent)(), iVar5 != -1)) {
                uVar7 = *(uint *)(__s + 0x18);
                do {
                  iVar5 = (*aSyscall[6].pCurrent)((ulong)uVar7);
                  if (-1 < iVar5) break;
                  piVar9 = __errno_location();
                } while (*piVar9 == 4);
                if (iVar5 == 0) goto LAB_001574c8;
                iVar5 = 0x120a;
                unixLogErrorAtLine(0x120a,"ftruncate",(char *)zBuf,0x6ac0);
                bVar16 = false;
              }
              else {
LAB_001574c8:
                iVar5 = 0;
                bVar16 = true;
              }
              if (bVar16) {
                if (*(int *)(__s + 0x18) < 0) {
                  iVar5 = 0;
                }
                else {
                  iVar5 = (*aSyscall[7].pCurrent)();
                  iVar5 = (uint)(iVar5 == -1) * 5;
                }
              }
              bVar16 = iVar5 == 0;
            }
          }
          else {
            bVar16 = true;
          }
        }
        else {
          iVar5 = 0x70a;
LAB_00157104:
          __s = (_func_int_sqlite3_file_ptr_sqlite3_int64 *)0x0;
LAB_00157135:
          bVar16 = false;
        }
        if (bVar16) goto LAB_0015713c;
        unixShmPurge((unixFile *)fd);
        sqlite3_free(p);
        if (sqlite3Config.bCoreMutex == 0) {
          psVar8 = (sqlite3_mutex *)0x0;
        }
        else {
          psVar8 = (*sqlite3Config.mutex.xMutexAlloc)(2);
        }
      }
      else {
LAB_0015713c:
        *(_func_int_sqlite3_file_ptr_sqlite3_int64 **)p = __s;
        *(int *)(__s + 0x30) = *(int *)(__s + 0x30) + 1;
        fd[8].pMethods = p;
        if (sqlite3Config.bCoreMutex == 0) {
          psVar8 = (sqlite3_mutex *)0x0;
        }
        else {
          psVar8 = (*sqlite3Config.mutex.xMutexAlloc)(2);
        }
        if (psVar8 != (sqlite3_mutex *)0x0) {
          (*sqlite3Config.mutex.xMutexLeave)(psVar8);
        }
        if (*(sqlite3_mutex **)(__s + 8) != (sqlite3_mutex *)0x0) {
          (*sqlite3Config.mutex.xMutexEnter)(*(sqlite3_mutex **)(__s + 8));
        }
        p->xClose = *(_func_int_sqlite3_file_ptr **)(__s + 0x38);
        *(sqlite3_io_methods **)(__s + 0x38) = p;
        psVar8 = *(sqlite3_mutex **)(__s + 8);
        iVar5 = 0;
      }
      if (psVar8 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(psVar8);
      }
    }
    if (iVar5 != 0) {
      return iVar5;
    }
  }
  lVar2 = *(long *)fd[8].pMethods;
  if (*(sqlite3_mutex **)(lVar2 + 8) != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(*(sqlite3_mutex **)(lVar2 + 8));
  }
  iVar5 = 0;
  if (iRegion < (int)(uint)*(ushort *)(lVar2 + 0x20)) goto LAB_0015746f;
  *(int *)(lVar2 + 0x1c) = szRegion;
  iVar5 = 0;
  if (-1 < (int)*(uint *)(lVar2 + 0x18)) {
    iVar5 = (*aSyscall[5].pCurrent)((ulong)*(uint *)(lVar2 + 0x18),local_c0);
    if (iVar5 != 0) {
      iVar5 = 0x130a;
      goto LAB_0015746f;
    }
    iVar6 = (iRegion + 1) * szRegion;
    iVar5 = 0;
    if (local_90 < iVar6) {
      if (bExtend == 0) {
        iVar5 = 0;
        goto LAB_0015746f;
      }
      lVar15 = local_90 + 0xfff;
      if (-1 < local_90) {
        lVar15 = local_90;
      }
      iVar5 = iVar6 + 0xfff;
      if (-1 < iVar6) {
        iVar5 = iVar6;
      }
      iVar5 = iVar5 >> 0xc;
      iVar6 = (int)(lVar15 >> 0xc);
      bVar16 = iVar6 < iVar5;
      if (iVar6 < iVar5) {
        lVar15 = (lVar15 >> 0xc) << 0x20;
        iVar6 = seekAndWriteFd(*(int *)(lVar2 + 0x18),lVar15 >> 0x14 | 0xfff,"",1,(int *)0x0);
        if (iVar6 == 1) {
          lVar13 = (long)iVar5;
          lVar15 = lVar15 >> 0x20;
          iOff = lVar15 * 0x1000 + 0x1fff;
          do {
            lVar15 = lVar15 + 1;
            if (lVar13 == lVar15) {
              bVar16 = lVar13 != lVar15 && lVar15 <= lVar13;
              goto LAB_00157329;
            }
            iVar5 = seekAndWriteFd(*(int *)(lVar2 + 0x18),iOff,"",1,(int *)0x0);
            iOff = iOff + 0x1000;
          } while (iVar5 == 1);
          bVar16 = lVar15 < lVar13;
        }
        iVar5 = 0x130a;
        unixLogErrorAtLine(0x130a,"write",*(char **)(lVar2 + 0x10),0x6b3e);
      }
      else {
LAB_00157329:
        iVar5 = 0;
      }
      if (bVar16) goto LAB_0015746f;
    }
  }
  pvVar10 = *(void **)(lVar2 + 0x28);
  iVar6 = sqlite3_initialize();
  if (iVar6 == 0) {
    pvVar10 = sqlite3Realloc(pvVar10,(iRegion + 1) * 8);
  }
  else {
    pvVar10 = (void *)0x0;
  }
  if (pvVar10 == (void *)0x0) {
    iVar5 = 0xc0a;
  }
  else {
    *(void **)(lVar2 + 0x28) = pvVar10;
    sVar12 = (size_t)szRegion;
    do {
      if (iRegion < (int)(uint)*(ushort *)(lVar2 + 0x20)) break;
      if ((int)*(uint *)(lVar2 + 0x18) < 0) {
        iVar6 = sqlite3_initialize();
        if (iVar6 == 0) {
          pvVar10 = sqlite3Malloc(szRegion);
        }
        else {
          pvVar10 = (void *)0x0;
        }
        if (pvVar10 != (void *)0x0) {
          memset(pvVar10,0,sVar12);
          goto LAB_00157424;
        }
        iVar5 = 7;
        bVar16 = false;
      }
      else {
        pvVar10 = (void *)(*aSyscall[0x15].pCurrent)
                                    (0,sVar12,(ulong)((uint)(*(char *)(lVar2 + 0x22) == '\0') * 2 +
                                                     1),1,(ulong)*(uint *)(lVar2 + 0x18),
                                     *(ushort *)(lVar2 + 0x20) * sVar12);
        if (pvVar10 == (void *)0xffffffffffffffff) {
          pcVar14 = *(char **)(lVar2 + 0x10);
          puVar11 = (uint *)__errno_location();
          if (pcVar14 == (char *)0x0) {
            pcVar14 = "";
          }
          bVar16 = false;
          iVar5 = 0x150a;
          sqlite3_log(0x150a,"os_unix.c:%d: (%d) %s(%s) - %s",0x6b57,(ulong)*puVar11,"mmap",pcVar14,
                      "");
        }
        else {
LAB_00157424:
          uVar1 = *(ushort *)(lVar2 + 0x20);
          *(void **)(*(long *)(lVar2 + 0x28) + (ulong)uVar1 * 8) = pvVar10;
          *(ushort *)(lVar2 + 0x20) = uVar1 + 1;
          bVar16 = true;
        }
      }
    } while (bVar16);
  }
LAB_0015746f:
  if (iRegion < (int)(uint)*(ushort *)(lVar2 + 0x20)) {
    pvVar10 = *(void **)(*(long *)(lVar2 + 0x28) + (long)iRegion * 8);
  }
  else {
    pvVar10 = (void *)0x0;
  }
  *pp = pvVar10;
  iVar6 = 8;
  if (iVar5 != 0) {
    iVar6 = iVar5;
  }
  if (*(char *)(lVar2 + 0x22) == '\0') {
    iVar6 = iVar5;
  }
  if (*(sqlite3_mutex **)(lVar2 + 8) != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(*(sqlite3_mutex **)(lVar2 + 8));
  }
  return iVar6;
}

Assistant:

static int unixShmMap(
  sqlite3_file *fd,               /* Handle open on database file */
  int iRegion,                    /* Region to retrieve */
  int szRegion,                   /* Size of regions */
  int bExtend,                    /* True to extend file if necessary */
  void volatile **pp              /* OUT: Mapped memory */
){
  unixFile *pDbFd = (unixFile*)fd;
  unixShm *p;
  unixShmNode *pShmNode;
  int rc = SQLITE_OK;

  /* If the shared-memory file has not yet been opened, open it now. */
  if( pDbFd->pShm==0 ){
    rc = unixOpenSharedMemory(pDbFd);
    if( rc!=SQLITE_OK ) return rc;
  }

  p = pDbFd->pShm;
  pShmNode = p->pShmNode;
  sqlite3_mutex_enter(pShmNode->mutex);
  assert( szRegion==pShmNode->szRegion || pShmNode->nRegion==0 );
  assert( pShmNode->pInode==pDbFd->pInode );
  assert( pShmNode->h>=0 || pDbFd->pInode->bProcessLock==1 );
  assert( pShmNode->h<0 || pDbFd->pInode->bProcessLock==0 );

  if( pShmNode->nRegion<=iRegion ){
    char **apNew;                      /* New apRegion[] array */
    int nByte = (iRegion+1)*szRegion;  /* Minimum required file size */
    struct stat sStat;                 /* Used by fstat() */

    pShmNode->szRegion = szRegion;

    if( pShmNode->h>=0 ){
      /* The requested region is not mapped into this processes address space.
      ** Check to see if it has been allocated (i.e. if the wal-index file is
      ** large enough to contain the requested region).
      */
      if( osFstat(pShmNode->h, &sStat) ){
        rc = SQLITE_IOERR_SHMSIZE;
        goto shmpage_out;
      }
  
      if( sStat.st_size<nByte ){
        /* The requested memory region does not exist. If bExtend is set to
        ** false, exit early. *pp will be set to NULL and SQLITE_OK returned.
        */
        if( !bExtend ){
          goto shmpage_out;
        }

        /* Alternatively, if bExtend is true, extend the file. Do this by
        ** writing a single byte to the end of each (OS) page being
        ** allocated or extended. Technically, we need only write to the
        ** last page in order to extend the file. But writing to all new
        ** pages forces the OS to allocate them immediately, which reduces
        ** the chances of SIGBUS while accessing the mapped region later on.
        */
        else{
          static const int pgsz = 4096;
          int iPg;

          /* Write to the last byte of each newly allocated or extended page */
          assert( (nByte % pgsz)==0 );
          for(iPg=(sStat.st_size/pgsz); iPg<(nByte/pgsz); iPg++){
            if( seekAndWriteFd(pShmNode->h, iPg*pgsz + pgsz-1, "", 1, 0)!=1 ){
              const char *zFile = pShmNode->zFilename;
              rc = unixLogError(SQLITE_IOERR_SHMSIZE, "write", zFile);
              goto shmpage_out;
            }
          }
        }
      }
    }

    /* Map the requested memory region into this processes address space. */
    apNew = (char **)sqlite3_realloc(
        pShmNode->apRegion, (iRegion+1)*sizeof(char *)
    );
    if( !apNew ){
      rc = SQLITE_IOERR_NOMEM;
      goto shmpage_out;
    }
    pShmNode->apRegion = apNew;
    while(pShmNode->nRegion<=iRegion){
      void *pMem;
      if( pShmNode->h>=0 ){
        pMem = osMmap(0, szRegion,
            pShmNode->isReadonly ? PROT_READ : PROT_READ|PROT_WRITE, 
            MAP_SHARED, pShmNode->h, szRegion*(i64)pShmNode->nRegion
        );
        if( pMem==MAP_FAILED ){
          rc = unixLogError(SQLITE_IOERR_SHMMAP, "mmap", pShmNode->zFilename);
          goto shmpage_out;
        }
      }else{
        pMem = sqlite3_malloc(szRegion);
        if( pMem==0 ){
          rc = SQLITE_NOMEM;
          goto shmpage_out;
        }
        memset(pMem, 0, szRegion);
      }
      pShmNode->apRegion[pShmNode->nRegion] = pMem;
      pShmNode->nRegion++;
    }
  }

shmpage_out:
  if( pShmNode->nRegion>iRegion ){
    *pp = pShmNode->apRegion[iRegion];
  }else{
    *pp = 0;
  }
  if( pShmNode->isReadonly && rc==SQLITE_OK ) rc = SQLITE_READONLY;
  sqlite3_mutex_leave(pShmNode->mutex);
  return rc;
}